

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtprawpacket.h
# Opt level: O0

void __thiscall
jrtplib::RTPRawPacket::RTPRawPacket
          (RTPRawPacket *this,uint8_t *data,size_t datalen,RTPAddress *address,RTPTime *recvtime,
          bool rtp,RTPMemoryManager *mgr)

{
  bool rtp_local;
  RTPTime *recvtime_local;
  RTPAddress *address_local;
  size_t datalen_local;
  uint8_t *data_local;
  RTPRawPacket *this_local;
  
  RTPMemoryObject::RTPMemoryObject(&this->super_RTPMemoryObject,mgr);
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPRawPacket_00191b80;
  (this->receivetime).m_t = recvtime->m_t;
  this->packetdata = data;
  this->packetdatalength = datalen;
  this->senderaddress = address;
  this->isrtp = rtp;
  return;
}

Assistant:

inline RTPRawPacket::RTPRawPacket(uint8_t *data,size_t datalen,RTPAddress *address,RTPTime &recvtime,bool rtp,RTPMemoryManager *mgr):RTPMemoryObject(mgr),receivetime(recvtime)
{
	packetdata = data;
	packetdatalength = datalen;
	senderaddress = address;
	isrtp = rtp;
}